

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<128u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<128u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  bool bVar1;
  uintwide_t<128U,_unsigned_int,_void,_false> *v;
  unsigned_fast_type uVar2;
  long lVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  uintwide_t<128U,_unsigned_int,_void,_false> uVar6;
  byte local_b8 [64];
  uintwide_t<128U,_unsigned_int,_void,_false> t;
  uintwide_t<128U,_unsigned_int,_void,_false> local_58;
  uintwide_t<128U,_unsigned_int,_void,_false> tmp;
  
  iVar4 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar4 == 0x10) {
    t.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)this;
    t.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(this + 8);
    local_b8[0x10] = 0;
    local_b8[0x11] = 0;
    local_b8[0x12] = 0;
    local_b8[0x13] = 0;
    local_b8[0x14] = 0;
    local_b8[0x15] = 0;
    local_b8[0x16] = 0;
    local_b8[0x17] = 0;
    local_b8[0x18] = 0;
    local_b8[0x19] = 0;
    local_b8[0x1a] = 0;
    local_b8[0x1b] = 0;
    local_b8[0x1c] = 0;
    local_b8[0x1d] = 0;
    local_b8[0x1e] = 0;
    local_b8[0x1f] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    local_b8[0x20] = 0;
    local_b8[0x21] = 0;
    local_b8[0x22] = 0;
    local_b8[0x23] = 0;
    local_b8[0x24] = 0;
    local_b8[0x25] = 0;
    local_b8[0x26] = 0;
    local_b8[0x27] = 0;
    bVar1 = uintwide_t<128U,_unsigned_int,_void,_false>::is_zero(&t);
    if (bVar1) {
      local_b8[0x26] = 0x30;
      uVar5 = 0x26;
    }
    else {
      uVar2 = uintwide_t<128U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                        (&t,(char *)(local_b8 + 0x27),is_uppercase);
      uVar5 = 0x27 - uVar2;
    }
    if ((show_base) && (1 < (long)uVar5)) {
      local_b8[(int)uVar5 - 1] = !is_uppercase << 5 | 0x58;
      uVar5 = uVar5 - 2;
      local_b8[uVar5 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar5)) {
      uVar5 = uVar5 - 1;
      local_b8[uVar5 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar3 = 0;
      if (field_width < 0x28) {
        lVar3 = 0x27 - field_width;
      }
      while (lVar3 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        local_b8[uVar5 & 0xffffffff] = fill_char_str;
      }
    }
    local_b8[0x27] = 0;
  }
  else if (iVar4 == 10) {
    t.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)this;
    t.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(this + 8);
    local_b8[0x20] = 0;
    local_b8[0x21] = 0;
    local_b8[0x22] = 0;
    local_b8[0x23] = 0;
    local_b8[0x24] = 0;
    local_b8[0x25] = 0;
    local_b8[0x26] = 0;
    local_b8[0x27] = 0;
    local_b8[0x28] = 0;
    local_b8[0x29] = 0;
    local_b8[0x2a] = 0;
    local_b8[0x2b] = 0;
    local_b8[0x2c] = 0;
    local_b8[0x2d] = 0;
    local_b8[0x2e] = 0;
    local_b8[0x10] = 0;
    local_b8[0x11] = 0;
    local_b8[0x12] = 0;
    local_b8[0x13] = 0;
    local_b8[0x14] = 0;
    local_b8[0x15] = 0;
    local_b8[0x16] = 0;
    local_b8[0x17] = 0;
    local_b8[0x18] = 0;
    local_b8[0x19] = 0;
    local_b8[0x1a] = 0;
    local_b8[0x1b] = 0;
    local_b8[0x1c] = 0;
    local_b8[0x1d] = 0;
    local_b8[0x1e] = 0;
    local_b8[0x1f] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    bVar1 = uintwide_t<128U,_unsigned_int,_void,_false>::is_zero(&t);
    if (bVar1) {
      local_b8[0x2e] = 0x30;
      uVar5 = 0x2e;
    }
    else {
      uVar5 = 0x2f;
      while ((bVar1 = uintwide_t<128U,_unsigned_int,_void,_false>::is_zero(&t), uVar5 != 0 &&
             (!bVar1))) {
        tmp.values.super_array<unsigned_int,_4UL>.elems[0] =
             t.values.super_array<unsigned_int,_4UL>.elems[0];
        tmp.values.super_array<unsigned_int,_4UL>.elems[1] =
             t.values.super_array<unsigned_int,_4UL>.elems[1];
        tmp.values.super_array<unsigned_int,_4UL>.elems[2] =
             t.values.super_array<unsigned_int,_4UL>.elems[2];
        tmp.values.super_array<unsigned_int,_4UL>.elems[3] =
             t.values.super_array<unsigned_int,_4UL>.elems[3];
        uintwide_t<128U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
                  (&t,10,0,(uintwide_t<128U,_unsigned_int,_void,_false> *)0x0);
        local_58.values.super_array<unsigned_int,_4UL>.elems[0] =
             t.values.super_array<unsigned_int,_4UL>.elems[0];
        local_58.values.super_array<unsigned_int,_4UL>.elems[1] =
             t.values.super_array<unsigned_int,_4UL>.elems[1];
        local_58.values.super_array<unsigned_int,_4UL>.elems[2] =
             t.values.super_array<unsigned_int,_4UL>.elems[2];
        local_58.values.super_array<unsigned_int,_4UL>.elems[3] =
             t.values.super_array<unsigned_int,_4UL>.elems[3];
        v = uintwide_t<128U,_unsigned_int,_void,_false>::mul_by_limb(&local_58,10);
        uVar6 = wide_integer::operator-(&tmp,v);
        uVar5 = uVar5 - 1;
        local_b8[uVar5 & 0xffffffff] =
             (char)uVar6.values.super_array<unsigned_int,_4UL>.elems[0] + 0x30;
      }
    }
    if (show_pos && uVar5 != 0) {
      uVar5 = uVar5 - 1;
      local_b8[uVar5 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar3 = 0;
      if (field_width < 0x30) {
        lVar3 = 0x2f - field_width;
      }
      while (lVar3 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        local_b8[uVar5 & 0xffffffff] = fill_char_str;
      }
    }
    local_b8[0x2f] = 0;
  }
  else {
    if (iVar4 != 8) {
      return false;
    }
    t.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)this;
    t.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(this + 8);
    local_b8[0x20] = 0;
    local_b8[0x21] = 0;
    local_b8[0x22] = 0;
    local_b8[0x23] = 0;
    local_b8[0x24] = 0;
    local_b8[0x25] = 0;
    local_b8[0x26] = 0;
    local_b8[0x27] = 0;
    local_b8[0x28] = 0;
    local_b8[0x29] = 0;
    local_b8[0x2a] = 0;
    local_b8[0x2b] = 0;
    local_b8[0x2c] = 0;
    local_b8[0x2d] = 0;
    local_b8[0x2e] = 0;
    local_b8[0x2f] = 0;
    local_b8[0x10] = 0;
    local_b8[0x11] = 0;
    local_b8[0x12] = 0;
    local_b8[0x13] = 0;
    local_b8[0x14] = 0;
    local_b8[0x15] = 0;
    local_b8[0x16] = 0;
    local_b8[0x17] = 0;
    local_b8[0x18] = 0;
    local_b8[0x19] = 0;
    local_b8[0x1a] = 0;
    local_b8[0x1b] = 0;
    local_b8[0x1c] = 0;
    local_b8[0x1d] = 0;
    local_b8[0x1e] = 0;
    local_b8[0x1f] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    local_b8[0x30] = 0;
    local_b8[0x31] = 0;
    bVar1 = uintwide_t<128U,_unsigned_int,_void,_false>::is_zero(&t);
    if (bVar1) {
      local_b8[0x31] = 0x30;
      uVar5 = 0x31;
    }
    else {
      uVar5 = 0x32;
      while ((bVar1 = uintwide_t<128U,_unsigned_int,_void,_false>::is_zero(&t), uVar5 != 0 &&
             (!bVar1))) {
        uVar5 = uVar5 - 1;
        local_b8[uVar5 & 0xffffffff] =
             (byte)t.values.super_array<unsigned_int,_4UL>.elems[0] & 7 | 0x30;
        operator>>=((uintwide_t<128u,unsigned_int,void,false> *)&t,3);
      }
    }
    if (show_base && uVar5 != 0) {
      uVar5 = uVar5 - 1;
      local_b8[uVar5 & 0xffffffff] = 0x30;
    }
    if (show_pos && uVar5 != 0) {
      uVar5 = uVar5 - 1;
      local_b8[uVar5 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar3 = 0;
      if (field_width < 0x33) {
        lVar3 = 0x32 - field_width;
      }
      while (lVar3 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        local_b8[uVar5 & 0xffffffff] = fill_char_str;
      }
    }
    local_b8[0x32] = 0;
  }
  detail::strcpy_unsafe<char*,char*>(str_result,(char *)(local_b8 + uVar5));
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }